

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONScanner.cpp
# Opt level: O1

tokens __thiscall JSON::JSONScanner::Scan(JSONScanner *this)

{
  char16 cVar1;
  char16 *pcVar2;
  Token *pTVar3;
  code *pcVar4;
  bool bVar5;
  char16 *pcVar6;
  undefined4 *puVar7;
  char16 *pcVar8;
  char16_t *psz;
  char16_t *local_30;
  char16 *end;
  
  pcVar2 = this->currentChar;
  this->pTokenString = pcVar2;
  pcVar6 = this->inputText + this->inputLen;
  if (pcVar2 < pcVar6) {
    pcVar2 = pcVar2 + 3;
    do {
      pcVar8 = pcVar2;
      cVar1 = pcVar8[-3];
      if (0x1f < (ushort)cVar1) {
        if ((ushort)cVar1 < 0x5b) {
          switch(cVar1) {
          case L' ':
            goto switchD_00b7215e_caseD_20;
          case L'\"':
            this->currentChar = pcVar8 + -2;
            ScanString(this);
            return tkStrCon;
          case L',':
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkComma;
            return tkComma;
          case L'-':
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkSub;
            return tkSub;
          case L'0':
          case L'1':
          case L'2':
          case L'3':
          case L'4':
          case L'5':
          case L'6':
          case L'7':
          case L'8':
          case L'9':
            psz = pcVar8 + -3;
            this->currentChar = psz;
            bVar5 = IsJSONNumber(this);
            if (bVar5) {
              this->currentChar = psz;
              local_30 = (char16 *)0x0;
              end = (char16 *)
                    Js::NumberUtilities::StrToDbl<char16_t>(psz,&local_30,this->scriptContext);
              if (this->currentChar != local_30) {
                bVar5 = Js::NumberUtilities::IsNan((double)end);
                if (bVar5) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar7 = 1;
                  bVar5 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONScanner.cpp"
                                     ,0x5f,"(!Js::JavascriptNumber::IsNan(val))",
                                     "Bad result from string to double conversion");
                  if (!bVar5) {
                    pcVar4 = (code *)invalidInstructionException();
                    (*pcVar4)();
                  }
                  *puVar7 = 0;
                }
                pTVar3 = this->pToken;
                pTVar3->tk = tkFltCon;
                (pTVar3->u).field_0.pid = (IdentPtr)end;
                (pTVar3->u).field_2.maybeInt = false;
                this->currentChar = local_30;
                return tkFltCon;
              }
            }
            ThrowSyntaxError(this,-0x7ff5e9ea);
          case L':':
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkColon;
            return tkColon;
          }
        }
        else if ((ushort)cVar1 < 0x6e) {
          if (cVar1 == L'[') {
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkLBrack;
            return tkLBrack;
          }
          if (cVar1 == L']') {
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkRBrack;
            return tkRBrack;
          }
          if (cVar1 == L'f') {
            this->currentChar = pcVar8 + -2;
            if ((((pcVar8 + 1 < pcVar6) && (pcVar8[-2] == L'a')) && (pcVar8[-1] == L'l')) &&
               ((*pcVar8 == L's' && (pcVar8[1] == L'e')))) {
              this->currentChar = pcVar8 + 2;
              this->pToken->tk = tkFALSE;
              return tkFALSE;
            }
            goto LAB_00b724c3;
          }
        }
        else if ((ushort)cVar1 < 0x7b) {
          if (cVar1 == L'n') {
            this->currentChar = pcVar8 + -2;
            if (((pcVar8 < pcVar6) && (pcVar8[-2] == L'u')) &&
               ((pcVar8[-1] == L'l' && (*pcVar8 == L'l')))) {
              this->currentChar = pcVar8 + 1;
              this->pToken->tk = tkNULL;
              return tkNULL;
            }
            goto LAB_00b724c3;
          }
          if (cVar1 == L't') {
            this->currentChar = pcVar8 + -2;
            if ((((pcVar8 < pcVar6) && (pcVar8[-2] == L'r')) && (pcVar8[-1] == L'u')) &&
               (*pcVar8 == L'e')) {
              this->currentChar = pcVar8 + 1;
              this->pToken->tk = tkTRUE;
              return tkTRUE;
            }
            goto LAB_00b724c3;
          }
        }
        else {
          if (cVar1 == L'{') {
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkLCurly;
            return tkLCurly;
          }
          if (cVar1 == L'}') {
            this->currentChar = pcVar8 + -2;
            this->pToken->tk = tkRCurly;
            return tkRCurly;
          }
        }
switchD_00b7215e_caseD_21:
        this->currentChar = pcVar8 + -2;
LAB_00b724c3:
        ThrowSyntaxError(this,-0x7ff5e9e9);
      }
      if ((1 < (ushort)cVar1 - 9) && (cVar1 != L'\r')) {
        if (cVar1 != L'\0') goto switchD_00b7215e_caseD_21;
        this->currentChar = pcVar8 + -3;
        goto LAB_00b72186;
      }
switchD_00b7215e_caseD_20:
      pcVar2 = pcVar8 + 1;
    } while (pcVar8 + -2 < pcVar6);
    this->currentChar = pcVar8 + -2;
  }
LAB_00b72186:
  this->pToken->tk = tkEOF;
  return tkEOF;
}

Assistant:

tokens JSONScanner::Scan()
    {
        pTokenString = currentChar;

        while (currentChar < inputText + inputLen)
        {
            switch(ReadNextChar())
            {
            case 0:
                //EOF
                currentChar--;
                return (pToken->tk = tkEOF);

            case '\t':
            case '\r':
            case '\n':
            case ' ':
                //WS - keep looping
                break;

            case '"':
                //check for string
                return ScanString();

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                //decimal digit starts a number
                {
                    currentChar--;

                    // we use StrToDbl() here for compat with the rest of the engine. StrToDbl() accept a larger syntax.
                    // Verify first the JSON grammar.
                    const char16* saveCurrentChar = currentChar;
                    if(!IsJSONNumber())
                    {
                       ThrowSyntaxError(JSERR_JsonBadNumber);
                    }
                    currentChar = saveCurrentChar;
                    double val;
                    const char16* end = nullptr;
                    val = Js::NumberUtilities::StrToDbl(currentChar, &end, scriptContext);
                    if(currentChar == end)
                    {
                       ThrowSyntaxError(JSERR_JsonBadNumber);
                    }
                    AssertMsg(!Js::JavascriptNumber::IsNan(val), "Bad result from string to double conversion");
                    pToken->tk = tkFltCon;
                    pToken->SetDouble(val, false);
                    currentChar = end;
                    return tkFltCon;
                }

            case ',':
                return (pToken->tk = tkComma);

            case ':':
                return (pToken->tk = tkColon);

            case '[':
                return (pToken->tk = tkLBrack);

            case ']':
                return (pToken->tk = tkRBrack);

            case '-':
                return (pToken->tk = tkSub);

            case 'n':
                //check for 'null'
                if (currentChar + 2 < inputText + inputLen  && currentChar[0] == 'u' && currentChar[1] == 'l' && currentChar[2] == 'l')
                {
                    currentChar += 3;
                    return (pToken->tk = tkNULL);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case 't':
                //check for 'true'
                if (currentChar + 2 < inputText + inputLen  && currentChar[0] == 'r' && currentChar[1] == 'u' && currentChar[2] == 'e')
                {
                    currentChar += 3;
                    return (pToken->tk = tkTRUE);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case 'f':
                //check for 'false'
                if (currentChar + 3 < inputText + inputLen  && currentChar[0] == 'a' && currentChar[1] == 'l' && currentChar[2] == 's' && currentChar[3] == 'e')
                {
                    currentChar += 4;
                    return (pToken->tk = tkFALSE);
                }
               ThrowSyntaxError(JSERR_JsonIllegalChar);

            case '{':
                return (pToken->tk = tkLCurly);

            case '}':
                return (pToken->tk = tkRCurly);

            default:
               ThrowSyntaxError(JSERR_JsonIllegalChar);
            }

        }

        return (pToken->tk = tkEOF);
    }